

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.h
# Opt level: O0

lyd_node * lyd_child(lyd_node *node)

{
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    node_local = (lyd_node *)0x0;
  }
  else if (node->schema == (lysc_node *)0x0) {
    node_local = *(lyd_node **)(node + 1);
  }
  else if ((node->schema->nodetype & 0x711) == 0) {
    node_local = (lyd_node *)0x0;
  }
  else {
    node_local = *(lyd_node **)(node + 1);
  }
  return node_local;
}

Assistant:

static inline struct lyd_node *
lyd_child(const struct lyd_node *node)
{
    if (!node) {
        return NULL;
    }

    if (!node->schema) {
        /* opaq node */
        return ((const struct lyd_node_opaq *)node)->child;
    }

    if (node->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF)) {
        return ((const struct lyd_node_inner *)node)->child;
    }

    return NULL;
}